

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::ScanScalarEnd(void)

{
  int iVar1;
  RegEx *ex1;
  RegEx *ex1_00;
  RegEx local_50;
  RegEx local_30;
  
  if (ScanScalarEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ScanScalarEnd()::e);
    if (iVar1 != 0) {
      ex1 = EndScalar();
      ex1_00 = BlankOrBreak();
      Comment();
      operator+(&local_30,ex1_00,&local_50);
      operator|(&ScanScalarEnd::e,ex1,&local_30);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_30.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      __cxa_atexit(RegEx::~RegEx,&ScanScalarEnd::e,&__dso_handle);
      __cxa_guard_release(&ScanScalarEnd()::e);
    }
  }
  return &ScanScalarEnd::e;
}

Assistant:

inline const RegEx& ScanScalarEnd() {
  static const RegEx e = EndScalar() | (BlankOrBreak() + Comment());
  return e;
}